

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_thread_result ma_device_job_thread_entry(void *pUserData)

{
  ma_result mVar1;
  ma_job job;
  anon_union_8_2_cf9b0fbd_for_toc local_80 [13];
  
  if (pUserData != (void *)0x0) {
    while( true ) {
      mVar1 = ma_device_job_thread_next
                        ((ma_device_job_thread *)pUserData,(ma_job *)&local_80[0].breakup);
      if ((mVar1 != MA_SUCCESS) || (local_80[0].breakup.code == 0)) break;
      if ((ushort)local_80[0]._0_2_ < 0xd) {
        (*(code *)(&g_jobVTable)[(ushort)local_80[0]._0_2_])(local_80);
      }
    }
    return (ma_thread_result)0x0;
  }
  __assert_fail("pJobThread != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x6fa1,"ma_thread_result ma_device_job_thread_entry(void *)");
}

Assistant:

static ma_thread_result MA_THREADCALL ma_device_job_thread_entry(void* pUserData)
{
    ma_device_job_thread* pJobThread = (ma_device_job_thread*)pUserData;
    MA_ASSERT(pJobThread != NULL);

    for (;;) {
        ma_result result;
        ma_job job;

        result = ma_device_job_thread_next(pJobThread, &job);
        if (result != MA_SUCCESS) {
            break;
        }

        if (job.toc.breakup.code == MA_JOB_TYPE_QUIT) {
            break;
        }

        ma_job_process(&job);
    }

    return (ma_thread_result)0;
}